

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_uint0.c
# Opt level: O3

uint fmt_uint0(char *s,uint u,uint n)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = fmt_uint((char *)0x0,u);
  iVar2 = n - uVar1;
  if (uVar1 <= n && iVar2 != 0) {
    do {
      if (s == (char *)0x0) {
        s = (char *)0x0;
      }
      else {
        *s = '0';
        s = s + 1;
      }
      iVar2 = iVar2 + -1;
      uVar1 = n;
    } while (iVar2 != 0);
  }
  if (s != (char *)0x0) {
    fmt_uint(s,u);
  }
  return uVar1;
}

Assistant:

unsigned int fmt_uint0(char *s,unsigned int u,unsigned int n)
{
  unsigned int len;
  len = fmt_uint(FMT_LEN,u);
  while (len < n) { if (s) *s++ = '0'; ++len; }
  if (s) fmt_uint(s,u);
  return len;
}